

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O2

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteBool(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,bool b)

{
  Ch c;
  Ch c_00;
  undefined7 in_register_00000031;
  Ch c_01;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    internal::Stack<rapidjson::CrtAllocator>::Reserve<char>(&this->os_->stack_,5);
    GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,'f');
    c_00 = 's';
    c_01 = 'l';
    c = 'a';
  }
  else {
    internal::Stack<rapidjson::CrtAllocator>::Reserve<char>(&this->os_->stack_,4);
    c_00 = 'u';
    c_01 = 'r';
    c = 't';
  }
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,c);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,c_01);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,c_00);
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PutUnsafe(this->os_,'e');
  return true;
}

Assistant:

bool WriteBool(bool b)  {
        if (b) {
            PutReserve(*os_, 4);
            PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'r'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'e');
        }
        else {
            PutReserve(*os_, 5);
            PutUnsafe(*os_, 'f'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 's'); PutUnsafe(*os_, 'e');
        }
        return true;
    }